

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.hpp
# Opt level: O2

measurement units::measurement_cast_from_string(string *measurement_string,uint64_t match_flags)

{
  measurement mVar1;
  precise_measurement local_48;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)measurement_string);
  measurement_from_string(&local_48,&local_30,match_flags);
  std::__cxx11::string::~string((string *)&local_30);
  mVar1.units_ = (unit)((ulong)(uint)(float)local_48.units_.multiplier_ |
                       local_48.units_._8_8_ << 0x20);
  mVar1.value_ = local_48.value_;
  return mVar1;
}

Assistant:

inline measurement measurement_cast_from_string(
    std::string measurement_string,
    std::uint64_t match_flags = getDefaultFlags())
{
    return measurement_cast(
        measurement_from_string(std::move(measurement_string), match_flags));
}